

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int patternCompare(u8 *zPattern,u8 *zString,int esc,int noCase)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  u8 *z;
  bool bVar7;
  u8 *local_58;
  u8 *local_50;
  int local_44;
  uchar *local_40;
  uint local_34;
  
  if (zString == (u8 *)0x0 || zPattern == (u8 *)0x0) {
    return 0;
  }
  bVar1 = false;
  local_58 = zString;
  local_50 = zPattern;
  local_44 = noCase;
  uVar2 = jx9Utf8Read(zPattern,(uchar *)0x0,&local_50);
  if (uVar2 == 0) {
LAB_0013f012:
    return (uint)(*zString == '\0');
  }
  local_34 = esc;
LAB_0013edf1:
  if (uVar2 == 0x2a && !bVar1) {
    while( true ) {
      do {
        uVar2 = jx9Utf8Read(local_50,(uchar *)0x0,&local_50);
      } while (uVar2 == 0x2a);
      if (uVar2 != 0x3f) break;
      iVar3 = jx9Utf8Read(local_58,(uchar *)0x0,&local_58);
      if (iVar3 == 0) {
        return 0;
      }
    }
    if (uVar2 == 0) {
      return 1;
    }
    if (uVar2 == esc) {
      uVar2 = jx9Utf8Read(local_50,(uchar *)0x0,&local_50);
      if (uVar2 == 0) {
        return 0;
      }
    }
    else if (uVar2 == 0x5b) {
      return 0;
    }
    iVar3 = local_44;
    local_40 = local_50;
    z = local_58;
    do {
      uVar5 = jx9Utf8Read(z,(uchar *)0x0,&local_58);
      if (uVar5 == 0) {
        return 0;
      }
      if (iVar3 == 0) {
        if (uVar5 != uVar2) {
          do {
            uVar5 = jx9Utf8Read(local_58,(uchar *)0x0,&local_58);
            if (uVar5 == 0) break;
          } while (uVar5 != uVar2);
          goto LAB_0013f104;
        }
      }
      else {
        if ((int)uVar5 < 0x80) {
          uVar5 = (uint)""[(int)uVar5];
        }
        if ((int)uVar2 < 0x80) {
          uVar2 = (uint)""[(int)uVar2];
        }
        while ((uVar5 != 0 && (uVar5 != uVar2))) {
          uVar5 = jx9Utf8Read(local_58,(uchar *)0x0,&local_58);
          if ((int)uVar5 < 0x80) {
            uVar5 = (uint)""[(int)uVar5];
          }
        }
LAB_0013f104:
        if (uVar5 == 0) {
          return 0;
        }
      }
      z = local_58;
      iVar4 = patternCompare(local_40,local_58,esc,iVar3);
      if (iVar4 != 0) {
        return 1;
      }
    } while( true );
  }
  if (uVar2 == 0x3f && !bVar1) {
    bVar1 = false;
    iVar3 = jx9Utf8Read(local_58,(uchar *)0x0,&local_58);
    if (iVar3 == 0) {
      return 0;
    }
  }
  else {
    if (uVar2 == 0x5b) {
      if (esc == 0) {
        return 0;
      }
      iVar3 = jx9Utf8Read(local_58,(uchar *)0x0,&local_58);
      if (iVar3 == 0) {
        return 0;
      }
      uVar2 = 0;
      iVar4 = jx9Utf8Read(local_50,(uchar *)0x0,&local_50);
      bVar7 = iVar4 == 0x5e;
      if (bVar7) {
        iVar4 = jx9Utf8Read(local_50,(uchar *)0x0,&local_50);
      }
      local_40 = (uchar *)CONCAT44(local_40._4_4_,(uint)bVar7);
      iVar6 = 0;
      if (iVar4 != 0x5d) goto LAB_0013ef34;
      iVar6 = 0;
      uVar5 = (uint)(iVar3 == 0x5d);
LAB_0013ef1f:
      uVar2 = uVar5;
      iVar4 = jx9Utf8Read(local_50,(uchar *)0x0,&local_50);
LAB_0013ef34:
      if (iVar4 == 0x2d) {
        if ((*local_50 != ']') && (0 < iVar6 && *local_50 != '\0')) {
          iVar4 = jx9Utf8Read(local_50,(uchar *)0x0,&local_50);
          uVar5 = 1;
          if (iVar4 < iVar3) {
            uVar5 = uVar2;
          }
          bVar7 = iVar3 < iVar6;
          iVar6 = 0;
          if (bVar7) {
            uVar5 = uVar2;
          }
          goto LAB_0013ef1f;
        }
      }
      else {
        if (iVar4 == 0x5d) goto LAB_0013ef4a;
        if (iVar4 == 0) {
          return 0;
        }
      }
      iVar6 = iVar4;
      uVar5 = uVar2;
      if (iVar3 == iVar4) {
        uVar5 = 1;
      }
      goto LAB_0013ef1f;
    }
    bVar7 = bVar1 || uVar2 != esc;
    bVar1 = true;
    if (bVar7) {
      uVar5 = jx9Utf8Read(local_58,(uchar *)0x0,&local_58);
      if (local_44 != 0) {
        if ((int)uVar2 < 0x80) {
          uVar2 = (uint)""[(int)uVar2];
        }
        if ((int)uVar5 < 0x80) {
          uVar5 = (uint)""[(int)uVar5];
        }
      }
      bVar1 = false;
      if (uVar2 != uVar5) {
        return 0;
      }
    }
  }
  goto LAB_0013ef61;
LAB_0013ef4a:
  esc = local_34;
  if (uVar2 == (uint)local_40) {
    return 0;
  }
LAB_0013ef61:
  uVar2 = jx9Utf8Read(local_50,(uchar *)0x0,&local_50);
  zString = local_58;
  if (uVar2 == 0) goto LAB_0013f012;
  goto LAB_0013edf1;
}

Assistant:

static int patternCompare(
  const u8 *zPattern,              /* The glob pattern */
  const u8 *zString,               /* The string to compare against the glob */
  const int esc,                    /* The escape character */
  int noCase
){
  int c, c2;
  int invert;
  int seen;
  u8 matchOne = '?';
  u8 matchAll = '*';
  u8 matchSet = '[';
  int prevEscape = 0;     /* True if the previous character was 'escape' */

  if( !zPattern || !zString ) return 0;
  while( (c = jx9Utf8Read(zPattern, 0, &zPattern))!=0 ){
    if( !prevEscape && c==matchAll ){
      while( (c= jx9Utf8Read(zPattern, 0, &zPattern)) == matchAll
               || c == matchOne ){
        if( c==matchOne && jx9Utf8Read(zString, 0, &zString)==0 ){
          return 0;
        }
      }
      if( c==0 ){
        return 1;
      }else if( c==esc ){
        c = jx9Utf8Read(zPattern, 0, &zPattern);
        if( c==0 ){
          return 0;
        }
      }else if( c==matchSet ){
	  if( (esc==0) || (matchSet<0x80) ) return 0;
	  while( *zString && patternCompare(&zPattern[-1], zString, esc, noCase)==0 ){
          SQLITE_SKIP_UTF8(zString);
        }
        return *zString!=0;
      }
      while( (c2 = jx9Utf8Read(zString, 0, &zString))!=0 ){
        if( noCase ){
          GlogUpperToLower(c2);
          GlogUpperToLower(c);
          while( c2 != 0 && c2 != c ){
            c2 = jx9Utf8Read(zString, 0, &zString);
            GlogUpperToLower(c2);
          }
        }else{
          while( c2 != 0 && c2 != c ){
            c2 = jx9Utf8Read(zString, 0, &zString);
          }
        }
        if( c2==0 ) return 0;
		if( patternCompare(zPattern, zString, esc, noCase) ) return 1;
      }
      return 0;
    }else if( !prevEscape && c==matchOne ){
      if( jx9Utf8Read(zString, 0, &zString)==0 ){
        return 0;
      }
    }else if( c==matchSet ){
      int prior_c = 0;
      if( esc == 0 ) return 0;
      seen = 0;
      invert = 0;
      c = jx9Utf8Read(zString, 0, &zString);
      if( c==0 ) return 0;
      c2 = jx9Utf8Read(zPattern, 0, &zPattern);
      if( c2=='^' ){
        invert = 1;
        c2 = jx9Utf8Read(zPattern, 0, &zPattern);
      }
      if( c2==']' ){
        if( c==']' ) seen = 1;
        c2 = jx9Utf8Read(zPattern, 0, &zPattern);
      }
      while( c2 && c2!=']' ){
        if( c2=='-' && zPattern[0]!=']' && zPattern[0]!=0 && prior_c>0 ){
          c2 = jx9Utf8Read(zPattern, 0, &zPattern);
          if( c>=prior_c && c<=c2 ) seen = 1;
          prior_c = 0;
        }else{
          if( c==c2 ){
            seen = 1;
          }
          prior_c = c2;
        }
        c2 = jx9Utf8Read(zPattern, 0, &zPattern);
      }
      if( c2==0 || (seen ^ invert)==0 ){
        return 0;
      }
    }else if( esc==c && !prevEscape ){
      prevEscape = 1;
    }else{
      c2 = jx9Utf8Read(zString, 0, &zString);
      if( noCase ){
        GlogUpperToLower(c);
        GlogUpperToLower(c2);
      }
      if( c!=c2 ){
        return 0;
      }
      prevEscape = 0;
    }
  }
  return *zString==0;
}